

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall gvr::Model::setOriginFromPLY(Model *this,PLYReader *ply)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  double *pdVar6;
  void *pvVar7;
  long in_RDI;
  Exception *anon_var_0;
  string s;
  istringstream in;
  size_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffdb8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  PLYReader *in_stack_fffffffffffffdd0;
  string local_1e0 [32];
  istringstream local_1c0 [384];
  ulong local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x14e6a6);
  PLYReader::getComments
            (in_stack_fffffffffffffdd0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  for (local_40 = 0; uVar1 = local_40,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&local_28), uVar1 < sVar4; local_40 = local_40 + 1) {
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_28,local_40);
    std::__cxx11::istringstream::istringstream(local_1c0,(string *)pvVar5,_S_in);
    std::__cxx11::string::string(local_1e0);
    std::operator>>((istream *)local_1c0,local_1e0);
    iVar3 = std::__cxx11::string::compare((char *)local_1e0);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_1e0), iVar3 == 0)) {
      pdVar6 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),0);
      pvVar7 = (void *)std::istream::operator>>(local_1c0,pdVar6);
      pdVar6 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),1);
      pvVar7 = (void *)std::istream::operator>>(pvVar7,pdVar6);
      pdVar6 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),2);
      std::istream::operator>>(pvVar7,pdVar6);
      bVar2 = std::ios::fail();
      if ((bVar2 & 1) != 0) {
        in_stack_fffffffffffffdc0 =
             (basic_istream<char,_std::char_traits<char>_> *)
             gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),2);
        *(double *)in_stack_fffffffffffffdc0 = 0.0;
        in_stack_fffffffffffffdb8 =
             (SMatrix<double,_3,_3> *)
             gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),1);
        in_stack_fffffffffffffdb8->v[0][0] = 0.0;
        pdVar6 = gmath::SVector<double,_3>::operator[]((SVector<double,_3> *)(in_RDI + 0x10),0);
        *pdVar6 = 0.0;
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)local_1e0);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_1e0), iVar3 == 0)) {
      gmath::operator>>(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      gmath::operator>>(in_stack_fffffffffffffdc0,(SVector<double,_3> *)in_stack_fffffffffffffdb8);
    }
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::istringstream::~istringstream(local_1c0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffdc0);
  return;
}

Assistant:

void Model::setOriginFromPLY(PLYReader &ply)
{
  std::vector<std::string> comment;

  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    std::istringstream in(comment[i]);
    std::string s;

    in >> s;

    if (s.compare("Origin") == 0 || s.compare("origin") == 0)
    {
      in >> origin[0] >> origin[1] >> origin[2];

      if (in.fail())
      {
        origin[0]=origin[1]=origin[2]=0;
      }
    }

    if (s.compare("Camera") == 0 || s.compare("camera") == 0)
    {
      try
      {
        in >> Rc >> Tc;
      }
      catch (const gutil::Exception &)
      {
        Rc=0;
        Tc=0;
      }
    }
  }
}